

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathExtras.h
# Opt level: O2

unsigned_short llvm::reverseBits<unsigned_short>(unsigned_short Val)

{
  unsigned_short uVar1;
  byte *pbVar2;
  long lVar3;
  uchar uStack_5;
  uchar out [2];
  uchar in [2];
  
  pbVar2 = in;
  in = (uchar  [2])Val;
  lVar3 = 2;
  while (lVar3 != 0) {
    out[lVar3 + -1] = BitReverseTable256[*pbVar2];
    pbVar2 = pbVar2 + 1;
    lVar3 = lVar3 + -1;
  }
  uVar1._0_1_ = out[0];
  uVar1._1_1_ = out[1];
  return uVar1;
}

Assistant:

T reverseBits(T Val) {
  unsigned char in[sizeof(Val)];
  unsigned char out[sizeof(Val)];
  std::memcpy(in, &Val, sizeof(Val));
  for (unsigned i = 0; i < sizeof(Val); ++i)
    out[(sizeof(Val) - i) - 1] = BitReverseTable256[in[i]];
  std::memcpy(&Val, out, sizeof(Val));
  return Val;
}